

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04a.cpp
# Opt level: O1

int day4a::sum_of_real_rooms(string *input)

{
  int iVar1;
  long *__nptr;
  bool bVar2;
  istream *piVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  string line;
  string name;
  string checksum;
  istringstream stream;
  int local_23c;
  undefined1 *local_238;
  long local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  string local_1d8;
  long *local_1b8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_238 = &local_228;
  local_230 = 0;
  local_228 = 0;
  local_23c = 0;
  do {
    piVar3 = std::operator>>((istream *)local_1b0,(string *)&local_238);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      if (local_238 != &local_228) {
        operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      return local_23c;
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_1f8,local_238,local_238 + local_230 + -0xb);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_1d8,local_238 + local_230 + -6,local_238 + local_230 + -1);
    bVar2 = is_real_room(&local_1f8,&local_1d8);
    if (bVar2) {
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)local_218,local_238 + local_230 + -10,local_238 + local_230 + -7);
      __nptr = local_218[0];
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      *piVar4 = 0;
      lVar5 = strtol((char *)__nptr,(char **)&local_1b8,10);
      if (local_1b8 == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_00108cfb:
        uVar6 = std::__throw_out_of_range("stoi");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if (local_238 != &local_228) {
          operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
        }
        std::__cxx11::istringstream::~istringstream(local_1b0);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar6);
      }
      if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) goto LAB_00108cfb;
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
      if (local_218[0] != local_208) {
        operator_delete(local_218[0],local_208[0] + 1);
      }
      local_23c = local_23c + (int)lVar5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

int sum_of_real_rooms(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		int sum = 0;
		while(stream >> line) {
			std::string name{line.begin(), line.end() - 11};
			std::string checksum{line.end() - 6, line.end() - 1};
			if(is_real_room(name, checksum)) {
				sum += std::stoi(std::string{line.end() - 10, line.end() - 7});
			}
		}
		return sum;
	}